

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fscope_end(FuncState *fs)

{
  FuncScope *bl_00;
  LexState *ls_00;
  MSize idx_00;
  MSize idx;
  LexState *ls;
  FuncScope *bl;
  FuncState *fs_local;
  
  bl_00 = fs->bl;
  ls_00 = fs->ls;
  fs->bl = bl_00->prev;
  var_remove(ls_00,(uint)bl_00->nactvar);
  fs->freereg = fs->nactvar;
  if ((bl_00->flags & 0x18) == 8) {
    bcemit_INS(fs,(uint)bl_00->nactvar << 8 | 0x80000032);
  }
  if ((bl_00->flags & 2) != 0) {
    if ((bl_00->flags & 1) == 0) {
      gola_fixup(ls_00,bl_00);
      return;
    }
    idx_00 = gola_new(ls_00,(GCstr *)0x1,'\x04',fs->pc);
    ls_00->vtop = idx_00;
    gola_resolve(ls_00,bl_00,idx_00);
  }
  if ((bl_00->flags & 4) != 0) {
    gola_fixup(ls_00,bl_00);
  }
  return;
}

Assistant:

static void fscope_end(FuncState *fs)
{
  FuncScope *bl = fs->bl;
  LexState *ls = fs->ls;
  fs->bl = bl->prev;
  var_remove(ls, bl->nactvar);
  fs->freereg = fs->nactvar;
  lj_assertFS(bl->nactvar == fs->nactvar, "bad regalloc");
  if ((bl->flags & (FSCOPE_UPVAL|FSCOPE_NOCLOSE)) == FSCOPE_UPVAL)
    bcemit_AJ(fs, BC_UCLO, bl->nactvar, 0);
  if ((bl->flags & FSCOPE_BREAK)) {
    if ((bl->flags & FSCOPE_LOOP)) {
      MSize idx = gola_new(ls, NAME_BREAK, VSTACK_LABEL, fs->pc);
      ls->vtop = idx;  /* Drop break label immediately. */
      gola_resolve(ls, bl, idx);
    } else {  /* Need the fixup step to propagate the breaks. */
      gola_fixup(ls, bl);
      return;
    }
  }
  if ((bl->flags & FSCOPE_GOLA)) {
    gola_fixup(ls, bl);
  }
}